

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O0

bool __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>::
IsObjTypeSpecEquivalent
          (SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false> *this,
          Type *type,TypeEquivalenceRecord *record,uint *failedPropertyIndex)

{
  uint uVar1;
  EquivalentPropertyEntry *pEVar2;
  bool bVar3;
  EquivalentPropertyEntry *refInfo;
  uint pi;
  EquivalentPropertyEntry *properties;
  uint propertyCount;
  uint *failedPropertyIndex_local;
  TypeEquivalenceRecord *record_local;
  Type *type_local;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false> *this_local;
  
  uVar1 = record->propertyCount;
  pEVar2 = record->properties;
  refInfo._4_4_ = 0;
  while( true ) {
    if (uVar1 <= refInfo._4_4_) {
      return true;
    }
    bVar3 = IsObjTypeSpecEquivalentImpl<false>(this,type,pEVar2 + refInfo._4_4_);
    if (!bVar3) break;
    refInfo._4_4_ = refInfo._4_4_ + 1;
  }
  *failedPropertyIndex = refInfo._4_4_;
  return false;
}

Assistant:

bool SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::IsObjTypeSpecEquivalent(const Type* type, const TypeEquivalenceRecord& record, uint& failedPropertyIndex)
    {
        uint propertyCount = record.propertyCount;
        Js::EquivalentPropertyEntry* properties = record.properties;
        for (uint pi = 0; pi < propertyCount; pi++)
        {
            const EquivalentPropertyEntry* refInfo = &properties[pi];
            if (!this->IsObjTypeSpecEquivalentImpl<false>(type, refInfo))
            {
                failedPropertyIndex = pi;
                return false;
            }
        }

        return true;
    }